

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  uchar *dst;
  size_t size;
  
  lodepng_palette_clear(dest);
  lodepng_memcpy(dest,source,0x28);
  if (source->palette != (uchar *)0x0) {
    dst = (uchar *)malloc(0x400);
    dest->palette = dst;
    if (dst == (uchar *)0x0) {
      if (source->palettesize != 0) {
        return 0x53;
      }
      size = 0;
    }
    else {
      size = source->palettesize << 2;
    }
    lodepng_memcpy(dst,source->palette,size);
  }
  return 0;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source) {
  lodepng_color_mode_cleanup(dest);
  lodepng_memcpy(dest, source, sizeof(LodePNGColorMode));
  if (source->palette) {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if (!dest->palette && source->palettesize) return 83; /*alloc fail*/
    lodepng_memcpy(dest->palette, source->palette, source->palettesize * 4);
  }
  return 0;
}